

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O3

BOOL CopyFileA(LPCSTR lpExistingFileName,LPCSTR lpNewFileName,BOOL bFailIfExists)

{
  DWORD DVar1;
  int iVar2;
  BOOL BVar3;
  void *pvVar4;
  HANDLE hObject;
  char *lpPath;
  HANDLE hFile;
  DWORD *pDVar5;
  uint uVar6;
  long in_FS_OFFSET;
  undefined1 local_40e0 [8];
  stat SrcFileStats;
  DWORD bytes_written;
  DWORD local_403c;
  undefined1 local_4038 [4];
  DWORD bytes_read;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (!PAL_InitializeChakraCoreCalled) goto LAB_002bd1bf;
  pvVar4 = pthread_getspecific(CorUnix::thObjKey);
  if (pvVar4 == (void *)0x0) {
    CreateCurrentThreadData();
  }
  BVar3 = 0;
  hObject = CreateFileA(lpExistingFileName,0x80000000,1,(LPSECURITY_ATTRIBUTES)0x0,3,0,(HANDLE)0x0);
  if (hObject == (HANDLE)0xffffffffffffffff) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002bd1bf;
  }
  else {
    DVar1 = GetFileAttributesA(lpExistingFileName);
    if (DVar1 == 0xffffffff) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002bd1bf;
      BVar3 = 0;
      lpPath = (char *)0x0;
      goto LAB_002bd0b4;
    }
    lpPath = CorUnix::InternalStrdup(lpExistingFileName);
    if (lpPath == (char *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002bd1bf;
      lpPath = (char *)0x0;
      DVar1 = FILEGetLastErrorFromErrno();
LAB_002bd09f:
      pDVar5 = (DWORD *)__errno_location();
      *pDVar5 = DVar1;
LAB_002bd0ad:
      BVar3 = 0;
    }
    else {
      FILEDosToUnixPathA(lpPath);
      iVar2 = stat64(lpPath,(stat64 *)local_40e0);
      if (iVar2 == -1) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002bd1bf;
        DVar1 = FILEGetLastErrorFromErrnoAndFilename(lpPath);
        goto LAB_002bd09f;
      }
      BVar3 = 0;
      hFile = CreateFileA(lpNewFileName,0x40000000,1,(LPSECURITY_ATTRIBUTES)0x0,
                          (bFailIfExists == 0) + 1,0,(HANDLE)0x0);
      if (hFile != (HANDLE)0xffffffffffffffff) {
        CorUnix::InternalFree(lpPath);
        lpPath = CorUnix::InternalStrdup(lpNewFileName);
        if (lpPath == (char *)0x0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_002bd1bf;
          DVar1 = FILEGetLastErrorFromErrno();
        }
        else {
          FILEDosToUnixPathA(lpPath);
          uVar6 = 0x16d;
          if ((DVar1 & 1) == 0) {
            uVar6 = 0x1ff;
          }
          iVar2 = chmod(lpPath,uVar6 & (uint)SrcFileStats.st_nlink);
          if (iVar2 != -1) {
            while ((BVar3 = ReadFile(hObject,local_4038,0x4000,&local_403c,(LPOVERLAPPED)0x0),
                   BVar3 != 0 && (local_403c != 0))) {
              BVar3 = WriteFile(hFile,local_4038,local_403c,
                                (LPDWORD)((long)SrcFileStats.__glibc_reserved + 0x14),
                                (LPOVERLAPPED)0x0);
              if ((BVar3 == 0) || (SrcFileStats.__glibc_reserved[2]._4_4_ != local_403c))
              goto LAB_002bd185;
            }
            if (BVar3 != 0) {
              CloseHandle(hObject);
              BVar3 = 1;
              hObject = hFile;
              if (hFile == (HANDLE)0xffffffffffffffff) goto LAB_002bd0bc;
              goto LAB_002bd0b4;
            }
LAB_002bd185:
            if ((PAL_InitializeChakraCoreCalled == false) ||
               (((BVar3 = CloseHandle(hFile), BVar3 == 0 ||
                 (BVar3 = DeleteFileA(lpNewFileName), BVar3 == 0)) &&
                (PAL_InitializeChakraCoreCalled == false)))) goto LAB_002bd1bf;
            BVar3 = 0;
            goto LAB_002bd0b4;
          }
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_002bd1bf;
          DVar1 = FILEGetLastErrorFromErrnoAndFilename(lpPath);
        }
        pDVar5 = (DWORD *)__errno_location();
        *pDVar5 = DVar1;
        CloseHandle(hObject);
        hObject = hFile;
        goto LAB_002bd0ad;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002bd1bf;
    }
LAB_002bd0b4:
    CloseHandle(hObject);
LAB_002bd0bc:
    if (lpPath != (char *)0x0) {
      CorUnix::InternalFree(lpPath);
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return BVar3;
  }
LAB_002bd1bf:
  abort();
}

Assistant:

BOOL
PALAPI
CopyFileA(
      IN LPCSTR lpExistingFileName,
      IN LPCSTR lpNewFileName,
      IN BOOL bFailIfExists)
{
    CPalThread *pThread;
    HANDLE       hSource = INVALID_HANDLE_VALUE;
    HANDLE       hDest = INVALID_HANDLE_VALUE;
    DWORD        dwDestCreationMode;
    BOOL         bGood = FALSE;
    DWORD        dwSrcFileAttributes;
    struct stat  SrcFileStats;
    
    LPSTR lpUnixPath = NULL;
    const int    buffer_size = 16*1024;
    char        *buffer = (char*)alloca(buffer_size);
    DWORD        bytes_read;
    DWORD        bytes_written;
    int          permissions;


    PERF_ENTRY(CopyFileA);
    ENTRY("CopyFileA(lpExistingFileName=%p (%s), lpNewFileName=%p (%s), bFailIfExists=%d)\n",
          lpExistingFileName?lpExistingFileName:"NULL",
          lpExistingFileName?lpExistingFileName:"NULL",
          lpNewFileName?lpNewFileName:"NULL",
          lpNewFileName?lpNewFileName:"NULL", bFailIfExists);

    pThread = InternalGetCurrentThread();
    if ( bFailIfExists )
    {
        dwDestCreationMode = CREATE_NEW;
    }
    else
    {
        dwDestCreationMode = CREATE_ALWAYS;
    }
    
    hSource = CreateFileA( lpExistingFileName,
               GENERIC_READ,
               FILE_SHARE_READ,
               NULL,
               OPEN_EXISTING,
               0,
               NULL );

    if ( hSource == INVALID_HANDLE_VALUE )
    {
        ERROR("CreateFileA failed for %s\n", lpExistingFileName);
        goto done;
    }

    /* Need to preserve the file attributes */
    dwSrcFileAttributes = GetFileAttributesA(lpExistingFileName);
    if (dwSrcFileAttributes == 0xffffffff)
    {
        ERROR("GetFileAttributes failed for %s\n", lpExistingFileName);
        goto done;
    }

    /* Need to preserve the owner/group and chmod() flags */
    lpUnixPath = InternalStrdup(lpExistingFileName);
    if ( lpUnixPath == NULL )
    {
        ERROR("InternalStrdup() failed\n");
        pThread->SetLastError(FILEGetLastErrorFromErrno());
        goto done;
    }
    FILEDosToUnixPathA(lpUnixPath);
    if (stat (lpUnixPath, &SrcFileStats) == -1)
    {
        ERROR("stat() failed for %s\n", lpExistingFileName);
        pThread->SetLastError(FILEGetLastErrorFromErrnoAndFilename(lpUnixPath));
        goto done;
    }

    hDest = CreateFileA( lpNewFileName,
             GENERIC_WRITE,
             FILE_SHARE_READ,
             NULL,
             dwDestCreationMode,
             0,
             NULL );

    if ( hDest == INVALID_HANDLE_VALUE )
    {
        ERROR("CreateFileA failed for %s\n", lpNewFileName);    
        goto done;
    }

    InternalFree(lpUnixPath);
    lpUnixPath = InternalStrdup(lpNewFileName);
    if ( lpUnixPath == NULL )
    {
        ERROR("InternalStrdup() failed\n");
        pThread->SetLastError(FILEGetLastErrorFromErrno());
        goto done;
    }
    FILEDosToUnixPathA( lpUnixPath );
    
 
    // We don't set file attributes in CreateFile. The only attribute
    // that is reflected on disk in Unix is read-only, and we set that
    // here.
    permissions = (S_IRWXU | S_IRWXG | S_IRWXO);
    if ((dwSrcFileAttributes & FILE_ATTRIBUTE_READONLY) != 0)
    {
        permissions &= ~(S_IWUSR | S_IWGRP | S_IWOTH);
    }

    /* Make sure the new file has the same chmod() flags. */
    if (chmod(lpUnixPath, SrcFileStats.st_mode & permissions) == -1)
    {
        WARN ("chmod() failed to set mode 0x%x on new file\n",
              SrcFileStats.st_mode & permissions);
        pThread->SetLastError(FILEGetLastErrorFromErrnoAndFilename(lpUnixPath));
        goto done;
    }

    while( (bGood = ReadFile( hSource, buffer, buffer_size, &bytes_read, NULL ))
           && bytes_read > 0 )
    {
        bGood = ( WriteFile( hDest, buffer, bytes_read, &bytes_written, NULL )
          && bytes_written == bytes_read);
        if (!bGood) break;
    }

    if (!bGood)
    {
        ERROR("Copy failed\n");

        if ( !CloseHandle(hDest) ||
             !DeleteFileA(lpNewFileName) )
        {
            ERROR("Unable to clean up partial copy\n");
        }
        hDest = INVALID_HANDLE_VALUE;

        goto done;
    }
    
done:

    if ( hSource != INVALID_HANDLE_VALUE ) 
    {
        CloseHandle( hSource );
    }
    if ( hDest != INVALID_HANDLE_VALUE )
    {
        CloseHandle( hDest );
    }
    if (lpUnixPath) 
    {
        InternalFree(lpUnixPath);
    }

    LOGEXIT("CopyFileA returns BOOL %d\n", bGood);
    PERF_EXIT(CopyFileA);
    return bGood;
}